

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  int value_00;
  char *desc_local;
  Stream *pSStack_10;
  uint32_t value_local;
  Stream *stream_local;
  
  desc_local._4_4_ = value;
  pSStack_10 = stream;
  value_00 = Bitcast<int,unsigned_int&>((uint *)((long)&desc_local + 4));
  WriteS32Leb128(stream,value_00,desc);
  return;
}

Assistant:

void WriteS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  WriteS32Leb128(stream, Bitcast<int32_t>(value), desc);
}